

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall Am_Point_List::~Am_Point_List(Am_Point_List *this)

{
  bool bVar1;
  Am_Point_List *this_local;
  
  if (this->data != (Am_Point_List_Data *)0x0) {
    bVar1 = Am_Wrapper::Is_Zero(&this->data->super_Am_Wrapper);
    if (bVar1) {
      Am_Error();
    }
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = (Am_Point_List_Data *)0x0;
  this->item = (Am_Point_Item *)0x0;
  return;
}

Assistant:

Am_Point_List::~Am_Point_List()
{
  if (data) {
    if (data->Is_Zero())
      Am_Error();
    data->Release();
  }
  data = nullptr;
  item = nullptr;
}